

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c74_min_timer.h
# Opt level: O3

void __thiscall c74::min::timer_base::tick(timer_base *this)

{
  undefined8 uVar1;
  atoms a;
  undefined4 local_3c;
  void *local_38;
  undefined8 uStack_30;
  long local_28;
  void *local_20 [2];
  long local_10;
  
  local_38 = (void *)0x0;
  uStack_30 = 0;
  local_28 = 0;
  local_3c = 0xffffffff;
  if (*(long *)(this + 0x18) != 0) {
    (**(code **)(this + 0x20))(local_20,this + 8,&local_38,&local_3c);
    if (local_20[0] != (void *)0x0) {
      operator_delete(local_20[0],local_10 - (long)local_20[0]);
    }
    if (local_38 != (void *)0x0) {
      operator_delete(local_38,local_28 - (long)local_38);
    }
    return;
  }
  uVar1 = std::__throw_bad_function_call();
  if (local_38 != (void *)0x0) {
    operator_delete(local_38,local_28 - (long)local_38);
  }
  _Unwind_Resume(uVar1);
}

Assistant:

void tick_callback()
    {
        if (should_defer()) {
            defer();
        }
        else {
            tick();
        }
    }